

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::LocalDeclStatement(SQCompiler *this)

{
  SQInteger SVar1;
  SQInteger arg0;
  SQOpcode _op;
  SQFuncState *pSVar2;
  SQObject SVar3;
  SQObject local_40;
  
  Lex(this);
  if (this->_token == 0x11d) {
    Lex(this);
    SVar3 = Expect(this,0x102);
    local_40._unVal = SVar3._unVal;
    local_40._type = SVar3._type;
    Expect(this,0x28);
    CreateFunction(this,&local_40,false);
    pSVar2 = this->_fs;
    SVar1 = SQFuncState::PushTarget(pSVar2,-1);
    SQFuncState::AddInstruction(pSVar2,_OP_CLOSURE,SVar1,(this->_fs->_functions)._size - 1,0,0);
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_40);
    return;
  }
  do {
    SVar3 = Expect(this,0x102);
    local_40._unVal = SVar3._unVal;
    local_40._type = SVar3._type;
    if (this->_token == 0x3d) {
      Lex(this);
      Expression(this);
      SVar1 = SQFuncState::PopTarget(this->_fs);
      arg0 = SQFuncState::PushTarget(this->_fs,-1);
      if (arg0 != SVar1) {
        pSVar2 = this->_fs;
        _op = _OP_MOVE;
        goto LAB_00110eb9;
      }
    }
    else {
      pSVar2 = this->_fs;
      arg0 = SQFuncState::PushTarget(pSVar2,-1);
      _op = _OP_LOADNULLS;
      SVar1 = 1;
LAB_00110eb9:
      SQFuncState::AddInstruction(pSVar2,_op,arg0,SVar1,0,0);
    }
    SQFuncState::PopTarget(this->_fs);
    SQFuncState::PushLocalVariable(this->_fs,&local_40);
    if (this->_token != 0x2c) {
      return;
    }
    Lex(this);
  } while( true );
}

Assistant:

void LocalDeclStatement()
    {
        SQObject varname;
        Lex();
        if( _token == TK_FUNCTION) {
            Lex();
            varname = Expect(TK_IDENTIFIER);
            Expect(_SC('('));
            CreateFunction(varname,false);
            _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            return;
        }

        do {
            varname = Expect(TK_IDENTIFIER);
            if(_token == _SC('=')) {
                Lex(); Expression();
                SQInteger src = _fs->PopTarget();
                SQInteger dest = _fs->PushTarget();
                if(dest != src) _fs->AddInstruction(_OP_MOVE, dest, src);
            }
            else{
                _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(),1);
            }
            _fs->PopTarget();
            _fs->PushLocalVariable(varname);
            if(_token == _SC(',')) Lex(); else break;
        } while(1);
    }